

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O0

void __thiscall
capnp::compiler::Compiler::Impl::eagerlyCompile
          (Impl *this,uint64_t id,uint eagerness,SchemaLoader *finalLoader)

{
  Node *this_00;
  Reader *pRVar1;
  word *pwVar2;
  uchar *puVar3;
  size_t __n;
  MessageSize MVar4;
  ArrayPtr<capnp::word> AVar5;
  ArrayPtr<unsigned_char> AVar6;
  __enable_if_t<is_constructible<value_type,_pair<unsigned_long,_Reader>_&&>::value,_pair<iterator,_bool>_>
  _Var7;
  Fault local_190;
  Fault f;
  Reader local_178;
  uint64_t local_148;
  pair<unsigned_long,_capnp::schema::Node::SourceInfo::Reader> local_140;
  Reader *local_108;
  word *pwStack_100;
  ArrayPtr<unsigned_char> local_f0;
  uint64_t local_e0;
  uint local_d8;
  undefined1 auStack_d0 [8];
  ArrayPtr<capnp::word> words;
  Reader *sourceInfo;
  Reader *__end3;
  Reader *__begin3;
  Vector<capnp::schema::Node::SourceInfo::Reader> *__range3;
  undefined1 local_90 [8];
  Vector<capnp::schema::Node::SourceInfo::Reader> sourceInfos;
  unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
  seen;
  Node *node;
  SchemaLoader *finalLoader_local;
  uint64_t uStack_18;
  uint eagerness_local;
  uint64_t id_local;
  Impl *this_local;
  
  uStack_18 = id;
  id_local = (uint64_t)this;
  seen._M_h._M_single_bucket = (__node_base_ptr)findNode(this,id);
  this_00 = kj::_::readMaybe<capnp::compiler::Compiler::Node>
                      ((Maybe<capnp::compiler::Compiler::Node_&> *)&seen._M_h._M_single_bucket);
  if (this_00 != (Node *)0x0) {
    std::
    unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
    ::unordered_map((unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
                     *)&sourceInfos.builder.disposer);
    kj::Vector<capnp::schema::Node::SourceInfo::Reader>::Vector
              ((Vector<capnp::schema::Node::SourceInfo::Reader> *)local_90);
    Node::traverse(this_00,eagerness,
                   (unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
                    *)&sourceInfos.builder.disposer,finalLoader,
                   (Vector<capnp::schema::Node::SourceInfo::Reader> *)local_90);
    __end3 = kj::Vector<capnp::schema::Node::SourceInfo::Reader>::begin
                       ((Vector<capnp::schema::Node::SourceInfo::Reader> *)local_90);
    pRVar1 = kj::Vector<capnp::schema::Node::SourceInfo::Reader>::end
                       ((Vector<capnp::schema::Node::SourceInfo::Reader> *)local_90);
    for (; __end3 != pRVar1; __end3 = __end3 + 1) {
      words.size_ = (size_t)__end3;
      MVar4 = capnp::schema::Node::SourceInfo::Reader::totalSize(__end3);
      local_e0 = MVar4.wordCount;
      local_d8 = MVar4.capCount;
      AVar5 = kj::Arena::allocateArray<capnp::word>(&this->nodeArena,local_e0 + 1);
      words.ptr = (word *)AVar5.size_;
      auStack_d0 = (undefined1  [8])AVar5.ptr;
      pwVar2 = kj::ArrayPtr<capnp::word>::begin((ArrayPtr<capnp::word> *)auStack_d0);
      AVar6 = kj::ArrayPtr<capnp::word>::asBytes((ArrayPtr<capnp::word> *)auStack_d0);
      local_f0.size_ = AVar6.size_;
      puVar3 = AVar6.ptr;
      local_f0.ptr = puVar3;
      __n = kj::ArrayPtr<unsigned_char>::size(&local_f0);
      memset(pwVar2,0,__n);
      local_108 = (Reader *)auStack_d0;
      pwStack_100 = words.ptr;
      AVar5.size_ = (size_t)puVar3;
      AVar5.ptr = words.ptr;
      copyToUnchecked<capnp::schema::Node::SourceInfo::Reader&>
                ((capnp *)words.size_,(Reader *)auStack_d0,AVar5);
      local_148 = capnp::schema::Node::SourceInfo::Reader::getId((Reader *)words.size_);
      pwVar2 = kj::ArrayPtr<capnp::word>::begin((ArrayPtr<capnp::word> *)auStack_d0);
      readMessageUnchecked<capnp::schema::Node::SourceInfo>(&local_178,pwVar2);
      std::make_pair<unsigned_long,capnp::schema::Node::SourceInfo::Reader>
                (&local_140,&local_148,&local_178);
      _Var7 = std::
              unordered_map<unsigned_long,capnp::schema::Node::SourceInfo::Reader,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,capnp::schema::Node::SourceInfo::Reader>>>
              ::insert<std::pair<unsigned_long,capnp::schema::Node::SourceInfo::Reader>>
                        ((unordered_map<unsigned_long,capnp::schema::Node::SourceInfo::Reader,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,capnp::schema::Node::SourceInfo::Reader>>>
                          *)&this->sourceInfoById,&local_140);
      f.exception = (Exception *)
                    _Var7.first.
                    super__Node_iterator_base<std::pair<const_unsigned_long,_capnp::schema::Node::SourceInfo::Reader>,_false>
                    ._M_cur;
    }
    kj::Vector<capnp::schema::Node::SourceInfo::Reader>::~Vector
              ((Vector<capnp::schema::Node::SourceInfo::Reader> *)local_90);
    std::
    unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
    ::~unordered_map((unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
                      *)&sourceInfos.builder.disposer);
    return;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[36],unsigned_long&>
            (&local_190,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/compiler.c++"
             ,0x50f,FAILED,(char *)0x0,"\"id did not come from this Compiler.\", id",
             (char (*) [36])"id did not come from this Compiler.",&stack0xffffffffffffffe8);
  kj::_::Debug::Fault::fatal(&local_190);
}

Assistant:

void Compiler::Impl::eagerlyCompile(uint64_t id, uint eagerness,
                                    const SchemaLoader& finalLoader) {
  KJ_IF_MAYBE(node, findNode(id)) {
    std::unordered_map<Node*, uint> seen;
    kj::Vector<schema::Node::SourceInfo::Reader> sourceInfos;
    node->traverse(eagerness, seen, finalLoader, sourceInfos);

    // Copy the SourceInfo structures into permanent space so that they aren't invalidated when
    // clearWorkspace() is called.
    for (auto& sourceInfo: sourceInfos) {
      auto words = nodeArena.allocateArray<word>(sourceInfo.totalSize().wordCount + 1);
      memset(words.begin(), 0, words.asBytes().size());
      copyToUnchecked(sourceInfo, words);
      sourceInfoById.insert(std::make_pair(sourceInfo.getId(),
          readMessageUnchecked<schema::Node::SourceInfo>(words.begin())));
    }
  } else {
    KJ_FAIL_REQUIRE("id did not come from this Compiler.", id);
  }
}